

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O3

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  lVar3 = SUNDenseMatrix_Data();
  lVar4 = SUNDenseMatrix_LData(A);
  if (0 < lVar4) {
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar2 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar6 * 8),val,tol);
      iVar5 = iVar5 + iVar2;
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
    if (0 < iVar5) {
      puts("Check_matrix_entry failures:");
      if (0 < lVar4) {
        lVar6 = 0;
        do {
          iVar2 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar6 * 8),val,tol);
          if (iVar2 != 0) {
            dVar1 = *(double *)(lVar3 + lVar6 * 8);
            printf("  Adata[%ld] = %g != %g (err = %g)\n",dVar1,val,ABS(dVar1 - val),lVar6);
          }
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
        return (uint)(0 < iVar5);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunrealtype* Adata;
  sunindextype Aldata;
  sunindextype i;

  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], val, tol);
  }

  if (failure > ZERO)
  {
    printf("Check_matrix_entry failures:\n");
    for (i = 0; i < Aldata; i++)
    {
      if (SUNRCompareTol(Adata[i], val, tol) != 0)
      {
        printf("  Adata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, Adata[i], val, SUNRabs(Adata[i] - val));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}